

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
tf::SmallVectorImpl<int>::append<int_const*>(SmallVectorImpl<int> *this,int *in_start,int *in_end)

{
  void **ppvVar1;
  void *pvVar2;
  ulong __n;
  
  __n = (long)in_end - (long)in_start;
  pvVar2 = (this->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
  if ((ulong)((long)(this->super_SmallVectorTemplateBase<int,_true>).
                    super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.CapacityX -
             (long)pvVar2) < __n) {
    SmallVectorBase::grow_pod
              ((SmallVectorBase *)this,
               &(this->super_SmallVectorTemplateBase<int,_true>).
                super_SmallVectorTemplateCommon<int,_void>.FirstEl,
               (long)pvVar2 +
               (__n - (long)(this->super_SmallVectorTemplateBase<int,_true>).
                            super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX)
               & 0xfffffffffffffffc,4);
  }
  if (in_start != in_end) {
    memcpy((this->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX,in_start,__n);
  }
  ppvVar1 = &(this->super_SmallVectorTemplateBase<int,_true>).
             super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
  *ppvVar1 = (void *)((long)*ppvVar1 + __n);
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > size_type(this->capacity_ptr()-this->end()))
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->setEnd(this->end() + NumInputs);
  }